

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

RegOpnd * __thiscall
Lowerer::GetRegOpnd(Lowerer *this,Opnd *opnd,Instr *insertInstr,Func *func,IRType type)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *dst;
  
  OVar2 = IR::Opnd::GetKind(opnd);
  if (OVar2 == OpndKindReg) {
    OVar2 = IR::Opnd::GetKind(opnd);
    dst = (RegOpnd *)opnd;
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    dst = IR::RegOpnd::New(type,func);
    InsertMove(&dst->super_Opnd,opnd,insertInstr,true);
  }
  return dst;
}

Assistant:

IR::RegOpnd * Lowerer::GetRegOpnd(IR::Opnd* opnd, IR::Instr* insertInstr, Func* func, IRType type)
{
    if (opnd->IsRegOpnd())
    {
        return opnd->AsRegOpnd();
    }
    IR::RegOpnd *regOpnd = IR::RegOpnd::New(type, func);
    InsertMove(regOpnd, opnd, insertInstr);
    return regOpnd;
}